

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_enc.cc
# Opt level: O3

int SSL_generate_key_block(SSL *ssl,uint8_t *out,size_t out_len)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  SSL_SESSION *pSVar4;
  SSL_SESSION *in_R8;
  Span<unsigned_char> out_00;
  
  iVar3 = SSL_in_init(ssl);
  if ((iVar3 == 0) && (uVar2 = bssl::ssl_protocol_version(ssl), uVar2 < 0x304)) {
    pSVar4 = SSL_get_session((SSL *)ssl);
    out_00.size_ = (size_t)pSVar4;
    out_00.data_ = (uchar *)out_len;
    bVar1 = bssl::generate_key_block((bssl *)ssl,(SSL *)out,out_00,in_R8);
    return (uint)bVar1;
  }
  ERR_put_error(0x10,0,0x42,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/t1_enc.cc"
                ,0xc3);
  return 0;
}

Assistant:

int SSL_generate_key_block(const SSL *ssl, uint8_t *out, size_t out_len) {
  // Which cipher state to use is ambiguous during a handshake. In particular,
  // there are points where read and write states are from different epochs.
  // During a handshake, before ChangeCipherSpec, the encryption states may not
  // match |ssl->s3->client_random| and |ssl->s3->server_random|.
  if (SSL_in_init(ssl) || ssl_protocol_version(ssl) > TLS1_2_VERSION) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  return generate_key_block(ssl, Span(out, out_len), SSL_get_session(ssl));
}